

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O1

void __thiscall
polyscope::CurveNetwork::fillNodeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  int iVar1;
  undefined1 auStack_78 [24];
  undefined1 local_60 [8];
  undefined8 local_58 [2];
  undefined1 local_48 [16];
  ManagedBufferRegistry *local_38 [2];
  
  local_38[0] = (ManagedBufferRegistry *)&stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"a_position","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(auStack_78 + 0x10));
  (*program->_vptr_ShaderProgram[0x13])(program,local_38,auStack_78 + 0x10);
  if (local_60 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
  }
  if (local_38[0] != (ManagedBufferRegistry *)&stack0xffffffffffffffd8) {
    operator_delete(local_38[0]);
  }
  iVar1 = std::__cxx11::string::compare((char *)&this->nodeRadiusQuantityName);
  if (iVar1 != 0) {
    resolveNodeRadiusQuantity(this);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"a_pointRadius","");
    render::ManagedBuffer<float>::getRenderAttributeBuffer((ManagedBuffer<float> *)auStack_78);
    (*program->_vptr_ShaderProgram[0x13])(program,local_58,auStack_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78._8_8_);
    }
    if ((undefined1 *)local_58[0] != local_48) {
      operator_delete((void *)local_58[0]);
    }
  }
  return;
}

Assistant:

void CurveNetwork::fillNodeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position", nodePositions.getRenderAttributeBuffer());

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_pointRadius", nodeRadQ.values.getRenderAttributeBuffer());
  }
}